

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IMC_Generator.cpp
# Opt level: O1

void __thiscall
nigel::IMC_Generator::generateMoveAB
          (IMC_Generator *this,OperationCombination comb,shared_ptr<nigel::IM_Operator> *lOp,
          shared_ptr<nigel::IM_Operator> *rOp,shared_ptr<nigel::Token> *token)

{
  int iVar1;
  undefined8 uVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_02;
  bool bVar3;
  undefined1 local_8a0 [20];
  undefined4 uStack_88c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_888;
  undefined1 local_880 [24];
  shared_ptr<nigel::IM_Operator> local_868;
  shared_ptr<nigel::IM_Operator> local_858;
  shared_ptr<nigel::IM_Operator> local_848;
  shared_ptr<nigel::IM_Operator> local_838;
  shared_ptr<nigel::IM_Operator> local_828;
  shared_ptr<nigel::IM_Operator> local_818;
  shared_ptr<nigel::IM_Operator> local_808;
  shared_ptr<nigel::Token> local_7f8;
  shared_ptr<nigel::IM_Operator> local_7e8;
  shared_ptr<nigel::IM_Operator> local_7d8;
  shared_ptr<nigel::IM_Operator> local_7c8;
  shared_ptr<nigel::IM_Operator> local_7b8;
  shared_ptr<nigel::IM_Operator> local_7a8;
  shared_ptr<nigel::IM_Operator> local_798;
  shared_ptr<nigel::IM_Operator> local_788;
  shared_ptr<nigel::IM_Operator> local_778;
  shared_ptr<nigel::IM_Operator> local_768;
  shared_ptr<nigel::IM_Operator> local_758;
  shared_ptr<nigel::IM_Operator> local_748;
  shared_ptr<nigel::IM_Operator> local_738;
  shared_ptr<nigel::IM_Operator> local_728;
  shared_ptr<nigel::IM_Operator> local_718;
  shared_ptr<nigel::IM_Operator> local_708;
  shared_ptr<nigel::IM_Operator> local_6f8;
  shared_ptr<nigel::IM_Operator> local_6e8;
  undefined1 local_6d8 [32];
  shared_ptr<nigel::IM_Operator> local_6b8;
  undefined1 local_6a8 [32];
  shared_ptr<nigel::IM_Operator> local_688;
  undefined1 local_678 [32];
  shared_ptr<nigel::IM_Operator> local_658;
  undefined1 local_648 [32];
  shared_ptr<nigel::IM_Operator> local_628;
  undefined1 local_618 [32];
  shared_ptr<nigel::IM_Operator> local_5f8;
  undefined1 local_5e8 [32];
  shared_ptr<nigel::IM_Operator> local_5c8;
  undefined1 local_5b8 [32];
  shared_ptr<nigel::IM_Operator> local_598;
  shared_ptr<nigel::IM_Operator> local_588;
  shared_ptr<nigel::IM_Operator> local_578;
  shared_ptr<nigel::IM_Operator> local_568;
  shared_ptr<nigel::IM_Operator> local_558;
  shared_ptr<nigel::IM_Operator> local_548;
  shared_ptr<nigel::IM_Operator> local_538;
  shared_ptr<nigel::IM_Operator> local_528;
  shared_ptr<nigel::IM_Operator> local_518;
  shared_ptr<nigel::IM_Operator> local_508;
  shared_ptr<nigel::IM_Operator> local_4f8;
  shared_ptr<nigel::IM_Operator> local_4e8;
  shared_ptr<nigel::IM_Operator> local_4d8;
  shared_ptr<nigel::IM_Operator> local_4c8;
  shared_ptr<nigel::IM_Operator> local_4b8;
  shared_ptr<nigel::IM_Operator> local_4a8;
  shared_ptr<nigel::IM_Operator> local_498;
  shared_ptr<nigel::IM_Operator> local_488;
  shared_ptr<nigel::IM_Operator> local_478;
  shared_ptr<nigel::IM_Operator> local_468;
  shared_ptr<nigel::IM_Operator> local_458;
  shared_ptr<nigel::IM_Operator> local_448;
  shared_ptr<nigel::IM_Operator> local_438;
  shared_ptr<nigel::IM_Operator> local_428;
  shared_ptr<nigel::IM_Operator> local_418;
  shared_ptr<nigel::IM_Operator> local_408;
  shared_ptr<nigel::IM_Operator> local_3f8;
  shared_ptr<nigel::IM_Operator> local_3e8;
  shared_ptr<nigel::IM_Operator> local_3d8;
  shared_ptr<nigel::IM_Operator> local_3c8;
  shared_ptr<nigel::IM_Operator> local_3b8;
  shared_ptr<nigel::IM_Operator> local_3a8;
  shared_ptr<nigel::IM_Operator> local_398;
  shared_ptr<nigel::IM_Operator> local_388;
  shared_ptr<nigel::IM_Operator> local_378;
  shared_ptr<nigel::IM_Operator> local_368;
  shared_ptr<nigel::IM_Operator> local_358;
  shared_ptr<nigel::IM_Operator> local_348;
  shared_ptr<nigel::IM_Operator> local_338;
  shared_ptr<nigel::IM_Operator> local_328;
  shared_ptr<nigel::IM_Operator> local_318;
  shared_ptr<nigel::IM_Operator> local_308;
  shared_ptr<nigel::IM_Operator> local_2f8;
  shared_ptr<nigel::IM_Operator> local_2e8;
  shared_ptr<nigel::IM_Operator> local_2d8;
  shared_ptr<nigel::IM_Operator> local_2c8;
  shared_ptr<nigel::IM_Operator> local_2b8;
  shared_ptr<nigel::IM_Operator> local_2a8;
  shared_ptr<nigel::IM_Operator> local_298;
  shared_ptr<nigel::IM_Operator> local_288;
  shared_ptr<nigel::IM_Operator> local_278;
  shared_ptr<nigel::IM_Operator> local_268;
  shared_ptr<nigel::IM_Operator> local_258;
  shared_ptr<nigel::IM_Operator> local_248;
  shared_ptr<nigel::IM_Operator> local_238;
  shared_ptr<nigel::IM_Operator> local_228;
  shared_ptr<nigel::IM_Operator> local_218;
  shared_ptr<nigel::IM_Operator> local_208;
  shared_ptr<nigel::IM_Operator> local_1f8;
  shared_ptr<nigel::IM_Operator> local_1e8;
  shared_ptr<nigel::IM_Operator> local_1d8;
  shared_ptr<nigel::IM_Operator> local_1c8;
  shared_ptr<nigel::IM_Operator> local_1b8;
  shared_ptr<nigel::IM_Operator> local_1a8;
  shared_ptr<nigel::IM_Operator> local_198;
  shared_ptr<nigel::IM_Operator> local_188;
  shared_ptr<nigel::IM_Operator> local_178;
  shared_ptr<nigel::IM_Operator> local_168;
  shared_ptr<nigel::IM_Operator> local_158;
  shared_ptr<nigel::IM_Operator> local_148;
  shared_ptr<nigel::IM_Operator> local_138;
  shared_ptr<nigel::IM_Operator> local_128;
  shared_ptr<nigel::IM_Operator> local_118;
  shared_ptr<nigel::IM_Operator> local_108;
  shared_ptr<nigel::IM_Operator> local_f8;
  shared_ptr<nigel::IM_Operator> local_e8;
  shared_ptr<nigel::IM_Operator> local_d8;
  shared_ptr<nigel::IM_Operator> local_c8;
  shared_ptr<nigel::IM_Operator> local_b8;
  shared_ptr<nigel::IM_Operator> local_a8;
  shared_ptr<nigel::IM_Operator> local_98;
  shared_ptr<nigel::IM_Operator> local_88;
  shared_ptr<nigel::IM_Operator> local_78;
  shared_ptr<nigel::IM_Operator> local_68;
  shared_ptr<nigel::IM_Operator> local_58;
  shared_ptr<nigel::IM_Operator> local_48;
  shared_ptr<nigel::IM_Operator> local_38;
  
  switch(comb) {
  case vv:
    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_8a0);
    if (*(int *)(local_8a0._0_8_ + 0x1c) == 0) {
      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_880);
      bVar3 = *(int *)(CONCAT44(local_880._4_4_,local_880._0_4_) + 0x1c) == 0;
      if ((element_type *)local_880._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_880._8_8_);
      }
    }
    else {
      bVar3 = false;
    }
    if ((element_type *)local_8a0._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_);
    }
    if (bVar3) {
      local_578.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_578.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
      if (local_578.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_578.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_578.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_578.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_578.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_8a0._16_4_ = 0xf0;
      std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
                ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_8a0,
                 (allocator<nigel::IM_SFR> *)local_5b8,(SFR *)(local_8a0 + 0x10));
      uVar2 = local_8a0._8_8_;
      local_38.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_8a0._0_8_;
      local_38.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_;
      local_8a0._0_8_ = (element_type *)0x0;
      local_8a0._8_8_ = (element_type *)0x0;
      addCmd(this,mov_adr_adr,&local_578,&local_38);
      if ((element_type *)uVar2 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
      }
      if ((element_type *)local_8a0._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_);
      }
      if (local_578.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_578.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_588.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_588.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
      if ((element_type *)
          local_588.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(((element_type *)
                    local_588.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                   _M_weak_this.super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr =
               *(int *)&(((element_type *)
                         local_588.
                         super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                        _M_weak_this.
                        super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
          UNLOCK();
        }
        else {
          *(int *)&(((element_type *)
                    local_588.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                   _M_weak_this.super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr =
               *(int *)&(((element_type *)
                         local_588.
                         super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                        _M_weak_this.
                        super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
        }
      }
      local_158.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_158.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,mov_a_adr,&local_588,&local_158);
      this_01._M_pi =
           local_588.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      if (local_158.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_158.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        this_01._M_pi =
             local_588.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
      }
    }
    else {
      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_8a0);
      if (*(int *)(local_8a0._0_8_ + 0x1c) == 1) {
        IM_Operator::as<nigel::IM_Variable>((IM_Operator *)(local_8a0 + 0x10));
        bVar3 = *(int *)(CONCAT44(uStack_88c,local_8a0._16_4_) + 0x1c) == 0;
        if (local_888 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_888);
        }
      }
      else {
        bVar3 = false;
      }
      if ((element_type *)local_8a0._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_);
      }
      if (bVar3) {
        local_598.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_598.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
        if (local_598.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_598.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_598.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_598.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_598.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_168.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_168.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_dptr_const,&local_598,&local_168);
        if (local_168.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_168.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_598.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_598.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_178.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_178.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_188.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_188.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,movx_a_dptr,&local_178,&local_188);
        if (local_188.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_188.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_178.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_178.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_5b8._16_8_ =
             (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_5b8._24_8_ =
             (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
        if ((element_type *)local_5b8._24_8_ != (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&(((element_type *)local_5b8._24_8_)->
                     super_enable_shared_from_this<nigel::IM_Operator>)._M_weak_this.
                     super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 *(int *)&(((element_type *)local_5b8._24_8_)->
                          super_enable_shared_from_this<nigel::IM_Operator>)._M_weak_this.
                          super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                 1;
            UNLOCK();
          }
          else {
            *(int *)&(((element_type *)local_5b8._24_8_)->
                     super_enable_shared_from_this<nigel::IM_Operator>)._M_weak_this.
                     super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 *(int *)&(((element_type *)local_5b8._24_8_)->
                          super_enable_shared_from_this<nigel::IM_Operator>)._M_weak_this.
                          super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                 1;
          }
        }
        local_5b8._0_4_ = B;
        std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
                  ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_8a0,
                   (allocator<nigel::IM_SFR> *)local_5e8,(SFR *)local_5b8);
        uVar2 = local_8a0._8_8_;
        local_48.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_8a0._0_8_;
        local_48.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_;
        local_8a0._0_8_ = (element_type *)0x0;
        local_8a0._8_8_ = (element_type *)0x0;
        addCmd(this,mov_adr_adr,(shared_ptr<nigel::IM_Operator> *)(local_5b8 + 0x10),&local_48);
        if ((element_type *)uVar2 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
        }
        this_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5b8._24_8_;
        if ((element_type *)local_8a0._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_);
          this_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5b8._24_8_;
        }
      }
      else {
        IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_8a0);
        iVar1 = *(int *)(local_8a0._0_8_ + 0x1c);
        if ((iVar1 == 4) || (iVar1 == 2)) {
          IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_5b8);
          bVar3 = *(int *)(CONCAT44(local_5b8._4_4_,local_5b8._0_4_) + 0x1c) == 0;
        }
        else {
          bVar3 = false;
        }
        if (((iVar1 == 4) || (iVar1 == 2)) &&
           ((element_type *)local_5b8._8_8_ != (element_type *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5b8._8_8_);
        }
        if ((element_type *)local_8a0._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_);
        }
        if (bVar3) {
          local_5c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_5c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
          if (local_5c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_5c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_5c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_5c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_5c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          generateLoadStackR0(this,&local_5c8);
          if (local_5c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_5c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          local_5e8._16_8_ =
               (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_5e8._24_8_ =
               (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
               ._M_pi;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5e8._24_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5e8._24_8_)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5e8._24_8_)->_M_use_count
                   + 1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5e8._24_8_)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5e8._24_8_)->_M_use_count
                   + 1;
            }
          }
          local_5e8._0_4_ = B;
          std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
                    ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_8a0,
                     (allocator<nigel::IM_SFR> *)local_618,(SFR *)local_5e8);
          uVar2 = local_8a0._8_8_;
          local_58.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_8a0._0_8_;
          local_58.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_;
          local_8a0._0_8_ = (element_type *)0x0;
          local_8a0._8_8_ = (element_type *)0x0;
          addCmd(this,mov_adr_adr,(shared_ptr<nigel::IM_Operator> *)(local_5e8 + 0x10),&local_58);
          if ((element_type *)uVar2 != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
          }
          if ((element_type *)local_8a0._8_8_ != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5e8._24_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5e8._24_8_);
          }
          local_198.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_198.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_1a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_1a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          addCmd(this,mov_a_atr0,&local_198,&local_1a8);
          this_01._M_pi =
               local_198.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          if (local_1a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_1a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            this_01._M_pi =
                 local_198.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
          }
        }
        else {
          IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_8a0);
          if (*(int *)(local_8a0._0_8_ + 0x1c) == 0) {
            IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_5e8);
            bVar3 = *(int *)(CONCAT44(local_5e8._4_4_,local_5e8._0_4_) + 0x1c) == 1;
            if ((element_type *)local_5e8._8_8_ != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5e8._8_8_);
            }
          }
          else {
            bVar3 = false;
          }
          if ((element_type *)local_8a0._8_8_ != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_);
          }
          if (bVar3) {
            local_5f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            local_5f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                     _M_refcount._M_pi;
            if (local_5f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_5f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_5f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_5f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_5f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            local_1b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            local_1b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            addCmd(this,mov_dptr_const,&local_5f8,&local_1b8);
            if (local_1b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_1b8.
                         super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_5f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_5f8.
                         super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            local_1c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            local_1c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_1d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            local_1d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            addCmd(this,movx_a_dptr,&local_1c8,&local_1d8);
            if (local_1d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_1d8.
                         super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_1c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_1c8.
                         super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            local_618._0_4_ = B;
            std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
                      ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_8a0,
                       (allocator<nigel::IM_SFR> *)local_648,(SFR *)local_618);
            uVar2 = local_8a0._8_8_;
            local_68.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_8a0._0_8_;
            local_68.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_;
            local_8a0._0_8_ = (element_type *)0x0;
            local_8a0._8_8_ = (element_type *)0x0;
            local_1e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            local_1e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            addCmd(this,mov_adr_a,&local_68,&local_1e8);
            if (local_1e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_1e8.
                         super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((element_type *)uVar2 != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
            }
            if ((element_type *)local_8a0._8_8_ != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_);
            }
            local_618._16_8_ =
                 (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            local_618._24_8_ =
                 (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
            if ((element_type *)local_618._24_8_ != (element_type *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)&(((element_type *)local_618._24_8_)->
                         super_enable_shared_from_this<nigel::IM_Operator>)._M_weak_this.
                         super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     *(int *)&(((element_type *)local_618._24_8_)->
                              super_enable_shared_from_this<nigel::IM_Operator>)._M_weak_this.
                              super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 1;
                UNLOCK();
              }
              else {
                *(int *)&(((element_type *)local_618._24_8_)->
                         super_enable_shared_from_this<nigel::IM_Operator>)._M_weak_this.
                         super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     *(int *)&(((element_type *)local_618._24_8_)->
                              super_enable_shared_from_this<nigel::IM_Operator>)._M_weak_this.
                              super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 1;
              }
            }
            local_1f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            local_1f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            addCmd(this,mov_a_adr,(shared_ptr<nigel::IM_Operator> *)(local_618 + 0x10),&local_1f8);
            this_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_618._24_8_;
            if (local_1f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_1f8.
                         super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
              this_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_618._24_8_;
            }
          }
          else {
            IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_8a0);
            if (*(int *)(local_8a0._0_8_ + 0x1c) == 1) {
              IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_618);
              bVar3 = *(int *)(CONCAT44(local_618._4_4_,local_618._0_4_) + 0x1c) == 1;
              if ((element_type *)local_618._8_8_ != (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_618._8_8_);
              }
            }
            else {
              bVar3 = false;
            }
            if ((element_type *)local_8a0._8_8_ != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_);
            }
            if (bVar3) {
              local_628.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              local_628.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
              if (local_628.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_628.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_628.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_628.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_628.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              local_208.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              local_208.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              addCmd(this,mov_dptr_const,&local_628,&local_208);
              if (local_208.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_208.
                           super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              if (local_628.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_628.
                           super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              local_218.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              local_218.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_228.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              local_228.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              addCmd(this,movx_a_dptr,&local_218,&local_228);
              if (local_228.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_228.
                           super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              if (local_218.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_218.
                           super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              local_648._0_4_ = B;
              std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
                        ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_8a0,
                         (allocator<nigel::IM_SFR> *)local_678,(SFR *)local_648);
              uVar2 = local_8a0._8_8_;
              local_78.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)local_8a0._0_8_;
              local_78.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_;
              local_8a0._0_8_ = (element_type *)0x0;
              local_8a0._8_8_ = (element_type *)0x0;
              local_238.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              local_238.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              addCmd(this,mov_adr_a,&local_78,&local_238);
              if (local_238.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_238.
                           super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              if ((element_type *)uVar2 != (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
              }
              if ((element_type *)local_8a0._8_8_ != (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_);
              }
              local_648._16_8_ =
                   (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              local_648._24_8_ =
                   (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_648._24_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_648._24_8_)->_M_use_count =
                       ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_648._24_8_)->
                       _M_use_count + 1;
                  UNLOCK();
                }
                else {
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_648._24_8_)->_M_use_count =
                       ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_648._24_8_)->
                       _M_use_count + 1;
                }
              }
              local_248.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              local_248.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              addCmd(this,mov_dptr_const,(shared_ptr<nigel::IM_Operator> *)(local_648 + 0x10),
                     &local_248);
              if (local_248.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_248.
                           super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_648._24_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_648._24_8_);
              }
              local_258.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              local_258.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_268.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              local_268.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              addCmd(this,movx_a_dptr,&local_258,&local_268);
              this_01._M_pi =
                   local_258.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
              if (local_268.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_268.
                           super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
                this_01._M_pi =
                     local_258.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
              }
            }
            else {
              IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_8a0);
              iVar1 = *(int *)(local_8a0._0_8_ + 0x1c);
              if ((iVar1 == 4) || (iVar1 == 2)) {
                IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_648);
                bVar3 = *(int *)(CONCAT44(local_648._4_4_,local_648._0_4_) + 0x1c) == 1;
              }
              else {
                bVar3 = false;
              }
              if (((iVar1 == 4) || (iVar1 == 2)) &&
                 ((element_type *)local_648._8_8_ != (element_type *)0x0)) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_648._8_8_);
              }
              if ((element_type *)local_8a0._8_8_ != (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_);
              }
              if (bVar3) {
                local_658.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     = (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr;
                local_658.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi =
                     (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                     _M_refcount._M_pi;
                if (local_658.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (local_658.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_658.
                          super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (local_658.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_658.
                          super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                  }
                }
                generateLoadStackR0(this,&local_658);
                if (local_658.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_658.
                             super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                local_678._16_8_ =
                     (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
                local_678._24_8_ =
                     (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                     _M_refcount._M_pi;
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_678._24_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_678._24_8_)->_M_use_count
                         = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_678._24_8_)->
                           _M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_678._24_8_)->_M_use_count
                         = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_678._24_8_)->
                           _M_use_count + 1;
                  }
                }
                local_278.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     = (element_type *)0x0;
                local_278.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                addCmd(this,mov_dptr_const,(shared_ptr<nigel::IM_Operator> *)(local_678 + 0x10),
                       &local_278);
                if (local_278.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_278.
                             super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_678._24_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_678._24_8_);
                }
                local_288.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     = (element_type *)0x0;
                local_288.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                local_298.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     = (element_type *)0x0;
                local_298.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                addCmd(this,movx_a_dptr,&local_288,&local_298);
                if (local_298.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_298.
                             super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                if (local_288.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_288.
                             super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                local_678._0_4_ = B;
                std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
                          ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_8a0,
                           (allocator<nigel::IM_SFR> *)local_6a8,(SFR *)local_678);
                uVar2 = local_8a0._8_8_;
                local_88.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)local_8a0._0_8_;
                local_88.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_;
                local_8a0._0_8_ = (element_type *)0x0;
                local_8a0._8_8_ = (element_type *)0x0;
                local_2a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     = (element_type *)0x0;
                local_2a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                addCmd(this,mov_adr_a,&local_88,&local_2a8);
                if (local_2a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_2a8.
                             super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                if ((element_type *)uVar2 != (element_type *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
                }
                if ((element_type *)local_8a0._8_8_ != (element_type *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_);
                }
                local_2b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     = (element_type *)0x0;
                local_2b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                local_2c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     = (element_type *)0x0;
                local_2c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                addCmd(this,mov_a_atr0,&local_2b8,&local_2c8);
                this_01._M_pi =
                     local_2b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
                if (local_2c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_2c8.
                             super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                  this_01._M_pi =
                       local_2b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
                }
              }
              else {
                IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_8a0);
                if (*(int *)(local_8a0._0_8_ + 0x1c) == 0) {
                  IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_678);
                  bVar3 = (*(int *)(CONCAT44(local_678._4_4_,local_678._0_4_) + 0x1c) - 2U &
                          0xfffffffd) == 0;
                  if ((element_type *)local_678._8_8_ != (element_type *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_678._8_8_);
                  }
                }
                else {
                  bVar3 = false;
                }
                if ((element_type *)local_8a0._8_8_ != (element_type *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_);
                }
                if (bVar3) {
                  local_688.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)
                           ._M_ptr;
                  local_688.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi =
                       (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                       _M_refcount._M_pi;
                  if (local_688.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      (local_688.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_M_use_count =
                           (local_688.
                            super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      (local_688.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_M_use_count =
                           (local_688.
                            super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
                    }
                  }
                  generateLoadStackR0(this,&local_688);
                  if (local_688.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (local_688.
                               super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
                  }
                  local_6a8._0_4_ = B;
                  std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
                  __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
                            ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_8a0,
                             (allocator<nigel::IM_SFR> *)local_6d8,(SFR *)local_6a8);
                  uVar2 = local_8a0._8_8_;
                  local_98.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       = (element_type *)local_8a0._0_8_;
                  local_98.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi =
                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_;
                  local_8a0._0_8_ = (element_type *)0x0;
                  local_8a0._8_8_ = (element_type *)0x0;
                  local_2d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (element_type *)0x0;
                  local_2d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  addCmd(this,mov_adr_atr0,&local_98,&local_2d8);
                  if (local_2d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (local_2d8.
                               super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
                  }
                  if ((element_type *)uVar2 != (element_type *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
                  }
                  if ((element_type *)local_8a0._8_8_ != (element_type *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_);
                  }
                  local_6a8._16_8_ =
                       (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr;
                  local_6a8._24_8_ =
                       (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                       _M_refcount._M_pi;
                  if ((element_type *)local_6a8._24_8_ != (element_type *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      *(int *)&(((element_type *)local_6a8._24_8_)->
                               super_enable_shared_from_this<nigel::IM_Operator>)._M_weak_this.
                               super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr =
                           *(int *)&(((element_type *)local_6a8._24_8_)->
                                    super_enable_shared_from_this<nigel::IM_Operator>)._M_weak_this.
                                    super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + 1;
                      UNLOCK();
                    }
                    else {
                      *(int *)&(((element_type *)local_6a8._24_8_)->
                               super_enable_shared_from_this<nigel::IM_Operator>)._M_weak_this.
                               super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr =
                           *(int *)&(((element_type *)local_6a8._24_8_)->
                                    super_enable_shared_from_this<nigel::IM_Operator>)._M_weak_this.
                                    super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + 1;
                    }
                  }
                  local_2e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (element_type *)0x0;
                  local_2e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  addCmd(this,mov_a_adr,(shared_ptr<nigel::IM_Operator> *)(local_6a8 + 0x10),
                         &local_2e8);
                  this_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6a8._24_8_;
                  if (local_2e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (local_2e8.
                               super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
                    this_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6a8._24_8_
                    ;
                  }
                }
                else {
                  IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_8a0);
                  if (*(int *)(local_8a0._0_8_ + 0x1c) == 1) {
                    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_6a8);
                    bVar3 = (*(int *)(CONCAT44(local_6a8._4_4_,local_6a8._0_4_) + 0x1c) - 2U &
                            0xfffffffd) == 0;
                    if ((element_type *)local_6a8._8_8_ != (element_type *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6a8._8_8_);
                    }
                  }
                  else {
                    bVar3 = false;
                  }
                  if ((element_type *)local_8a0._8_8_ != (element_type *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_);
                  }
                  if (bVar3) {
                    local_6b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (rOp->
                             super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr;
                    local_6b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi =
                         (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                         _M_refcount._M_pi;
                    if (local_6b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        (local_6b8.
                         super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_use_count =
                             (local_6b8.
                              super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        (local_6b8.
                         super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_use_count =
                             (local_6b8.
                              super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
                      }
                    }
                    generateLoadStackR0(this,&local_6b8);
                    if (local_6b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_6b8.
                                 super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
                    }
                    local_6d8._0_4_ = B;
                    std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
                    __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
                              ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_8a0,
                               (allocator<nigel::IM_SFR> *)(local_880 + 0x14),(SFR *)local_6d8);
                    uVar2 = local_8a0._8_8_;
                    local_a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (element_type *)local_8a0._0_8_;
                    local_a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi =
                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_;
                    local_8a0._0_8_ = (element_type *)0x0;
                    local_8a0._8_8_ = (element_type *)0x0;
                    local_2f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (element_type *)0x0;
                    local_2f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    addCmd(this,mov_adr_atr0,&local_a8,&local_2f8);
                    if (local_2f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_2f8.
                                 super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
                    }
                    if ((element_type *)uVar2 != (element_type *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
                    }
                    if ((element_type *)local_8a0._8_8_ != (element_type *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_);
                    }
                    local_6d8._16_8_ =
                         (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr;
                    local_6d8._24_8_ =
                         (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                         _M_refcount._M_pi;
                    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6d8._24_8_ !=
                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6d8._24_8_)->
                        _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                       local_6d8._24_8_)->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6d8._24_8_)->
                        _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                       local_6d8._24_8_)->_M_use_count + 1;
                      }
                    }
                    local_308.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (element_type *)0x0;
                    local_308.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    addCmd(this,mov_dptr_const,(shared_ptr<nigel::IM_Operator> *)(local_6d8 + 0x10),
                           &local_308);
                    if (local_308.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_308.
                                 super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
                    }
                    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6d8._24_8_ !=
                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6d8._24_8_);
                    }
                    local_318.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (element_type *)0x0;
                    local_318.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    local_328.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (element_type *)0x0;
                    local_328.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    addCmd(this,movx_a_dptr,&local_318,&local_328);
                    this_01._M_pi =
                         local_318.
                         super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
                    if (local_328.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_328.
                                 super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
                      this_01._M_pi =
                           local_318.
                           super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
                    }
                  }
                  else {
                    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_8a0);
                    iVar1 = *(int *)(local_8a0._0_8_ + 0x1c);
                    if ((iVar1 == 4) || (iVar1 == 2)) {
                      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_6d8);
                      bVar3 = (*(int *)(CONCAT44(local_6d8._4_4_,local_6d8._0_4_) + 0x1c) - 2U &
                              0xfffffffd) == 0;
                    }
                    else {
                      bVar3 = false;
                    }
                    if (((iVar1 == 4) || (iVar1 == 2)) &&
                       ((element_type *)local_6d8._8_8_ != (element_type *)0x0)) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6d8._8_8_);
                    }
                    if ((element_type *)local_8a0._8_8_ != (element_type *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_);
                    }
                    if (!bVar3) {
                      return;
                    }
                    local_6e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (rOp->
                             super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr;
                    local_6e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi =
                         (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                         _M_refcount._M_pi;
                    if (local_6e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        (local_6e8.
                         super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_use_count =
                             (local_6e8.
                              super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        (local_6e8.
                         super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_use_count =
                             (local_6e8.
                              super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
                      }
                    }
                    generateLoadStackR0(this,&local_6e8);
                    if (local_6e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_6e8.
                                 super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
                    }
                    local_880._20_4_ = 0xf0;
                    std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
                    __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
                              ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_8a0,
                               (allocator<nigel::IM_SFR> *)(local_880 + 0x13),
                               (SFR *)(local_880 + 0x14));
                    uVar2 = local_8a0._8_8_;
                    local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (element_type *)local_8a0._0_8_;
                    local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi =
                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_;
                    local_8a0._0_8_ = (element_type *)0x0;
                    local_8a0._8_8_ = (element_type *)0x0;
                    local_338.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (element_type *)0x0;
                    local_338.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    addCmd(this,mov_adr_atr0,&local_b8,&local_338);
                    if (local_338.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_338.
                                 super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
                    }
                    if ((element_type *)uVar2 != (element_type *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
                    }
                    if ((element_type *)local_8a0._8_8_ != (element_type *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_);
                    }
                    local_6f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (lOp->
                             super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr;
                    local_6f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi =
                         (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                         _M_refcount._M_pi;
                    if (local_6f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        (local_6f8.
                         super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_use_count =
                             (local_6f8.
                              super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        (local_6f8.
                         super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_use_count =
                             (local_6f8.
                              super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
                      }
                    }
                    generateLoadStackR0(this,&local_6f8);
                    if (local_6f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_6f8.
                                 super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
                    }
                    local_348.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (element_type *)0x0;
                    local_348.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    local_358.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (element_type *)0x0;
                    local_358.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    addCmd(this,mov_a_atr0,&local_348,&local_358);
                    this_01._M_pi =
                         local_348.
                         super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
                    if (local_358.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_358.
                                 super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
                      this_01._M_pi =
                           local_348.
                           super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    break;
  case vc:
    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_8a0);
    iVar1 = *(int *)(local_8a0._0_8_ + 0x1c);
    if ((element_type *)local_8a0._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_);
    }
    if (iVar1 == 0) {
      local_880._0_4_ = B;
      std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
                ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_8a0,
                 (allocator<nigel::IM_SFR> *)(local_8a0 + 0x10),(SFR *)local_880);
      local_528.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_8a0._0_8_;
      local_528.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_;
      local_8a0._0_8_ = (element_type *)0x0;
      local_8a0._8_8_ = (element_type *)0x0;
      local_708.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_708.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
      if (local_708.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_708.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_708.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_708.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_708.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      addCmd(this,mov_adr_const,&local_528,&local_708);
      if (local_708.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_708.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((element_type *)
          local_528.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_528.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((element_type *)local_8a0._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_);
      }
      local_718.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_718.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
      if ((element_type *)
          local_718.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(((element_type *)
                    local_718.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                   _M_weak_this.super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr =
               *(int *)&(((element_type *)
                         local_718.
                         super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                        _M_weak_this.
                        super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
          UNLOCK();
        }
        else {
          *(int *)&(((element_type *)
                    local_718.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                   _M_weak_this.super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr =
               *(int *)&(((element_type *)
                         local_718.
                         super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                        _M_weak_this.
                        super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
        }
      }
      local_368.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_368.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,mov_a_adr,&local_718,&local_368);
      this_01._M_pi =
           local_718.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      if (local_368.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_368.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        this_01._M_pi =
             local_718.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
      }
    }
    else {
      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_8a0);
      iVar1 = *(int *)(local_8a0._0_8_ + 0x1c);
      if ((element_type *)local_8a0._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_);
      }
      if (iVar1 == 1) {
        local_880._0_4_ = B;
        std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
                  ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_8a0,
                   (allocator<nigel::IM_SFR> *)(local_8a0 + 0x10),(SFR *)local_880);
        local_538.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_8a0._0_8_;
        local_538.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_;
        local_8a0._0_8_ = (element_type *)0x0;
        local_8a0._8_8_ = (element_type *)0x0;
        local_728.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_728.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
        if (local_728.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_728.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_728.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_728.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_728.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        addCmd(this,mov_adr_const,&local_538,&local_728);
        if (local_728.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_728.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((element_type *)
            local_538.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_538.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((element_type *)local_8a0._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_);
        }
        local_738.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_738.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
        if (local_738.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_738.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_738.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_738.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_738.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_378.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_378.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_dptr_const,&local_738,&local_378);
        if (local_378.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_378.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_738.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_738.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_388.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_388.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_398.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_398.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,movx_a_dptr,&local_388,&local_398);
        this_01._M_pi =
             local_388.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        if (local_398.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_398.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
          this_01._M_pi =
               local_388.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
        }
      }
      else {
        IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_8a0);
        iVar1 = *(int *)(local_8a0._0_8_ + 0x1c);
        if ((element_type *)local_8a0._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_);
        }
        if ((iVar1 != 4) && (iVar1 != 2)) {
          return;
        }
        local_748.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_748.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
        if (local_748.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_748.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_748.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_748.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_748.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        generateLoadStackR0(this,&local_748);
        if (local_748.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_748.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_880._0_4_ = B;
        std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
                  ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_8a0,
                   (allocator<nigel::IM_SFR> *)(local_8a0 + 0x10),(SFR *)local_880);
        local_548.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_8a0._0_8_;
        local_548.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_;
        local_8a0._0_8_ = (element_type *)0x0;
        local_8a0._8_8_ = (element_type *)0x0;
        local_758.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_758.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
        if (local_758.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_758.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_758.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_758.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_758.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        addCmd(this,mov_adr_const,&local_548,&local_758);
        if (local_758.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_758.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((element_type *)
            local_548.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_548.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((element_type *)local_8a0._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_);
        }
        local_3a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_3a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_3b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_3b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_a_atr0,&local_3a8,&local_3b8);
        this_01._M_pi =
             local_3a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        if (local_3b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_3b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
          this_01._M_pi =
               local_3a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
        }
      }
    }
    break;
  case vt:
    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_8a0);
    iVar1 = *(int *)(local_8a0._0_8_ + 0x1c);
    if ((element_type *)local_8a0._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_);
    }
    if (iVar1 == 0) {
      local_768.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_768.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
      if ((element_type *)
          local_768.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(((element_type *)
                    local_768.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                   _M_weak_this.super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr =
               *(int *)&(((element_type *)
                         local_768.
                         super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                        _M_weak_this.
                        super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
          UNLOCK();
        }
        else {
          *(int *)&(((element_type *)
                    local_768.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                   _M_weak_this.super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr =
               *(int *)&(((element_type *)
                         local_768.
                         super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                        _M_weak_this.
                        super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
        }
      }
      local_3c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_3c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,mov_a_adr,&local_768,&local_3c8);
      this_01._M_pi =
           local_768.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      if (local_3c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_3c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        this_01._M_pi =
             local_768.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
      }
    }
    else {
      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_8a0);
      iVar1 = *(int *)(local_8a0._0_8_ + 0x1c);
      if ((element_type *)local_8a0._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_);
      }
      if (iVar1 == 1) {
        local_778.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_778.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
        if (local_778.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_778.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_778.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_778.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_778.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_3d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_3d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_dptr_const,&local_778,&local_3d8);
        if (local_3d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_3d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_778.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_778.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_3e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_3e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_3f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_3f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,movx_a_dptr,&local_3e8,&local_3f8);
        this_01._M_pi =
             local_3e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        if (local_3f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_3f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
          this_01._M_pi =
               local_3e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
        }
      }
      else {
        IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_8a0);
        iVar1 = *(int *)(local_8a0._0_8_ + 0x1c);
        if ((element_type *)local_8a0._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_);
        }
        if ((iVar1 != 4) && (iVar1 != 2)) {
          return;
        }
        local_788.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_788.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
        if (local_788.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_788.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_788.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_788.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_788.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        generateLoadStackR0(this,&local_788);
        if (local_788.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_788.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_408.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_408.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_418.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_418.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_a_atr0,&local_408,&local_418);
        this_01._M_pi =
             local_408.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        if (local_418.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_418.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
          this_01._M_pi =
               local_408.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
        }
      }
    }
    break;
  case cv:
    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_8a0);
    iVar1 = *(int *)(local_8a0._0_8_ + 0x1c);
    if ((element_type *)local_8a0._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_);
    }
    if (iVar1 == 0) {
      local_798.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_798.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
      if (local_798.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_798.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_798.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_798.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_798.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_880._0_4_ = B;
      std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
                ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_8a0,
                 (allocator<nigel::IM_SFR> *)(local_8a0 + 0x10),(SFR *)local_880);
      uVar2 = local_8a0._8_8_;
      local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_8a0._0_8_;
      local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_;
      local_8a0._0_8_ = (element_type *)0x0;
      local_8a0._8_8_ = (element_type *)0x0;
      addCmd(this,mov_adr_adr,&local_798,&local_c8);
      if ((element_type *)uVar2 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
      }
      if ((element_type *)local_8a0._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_);
      }
      if (local_798.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_798.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_7a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_7a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
      if ((element_type *)
          local_7a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(((element_type *)
                    local_7a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                   _M_weak_this.super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr =
               *(int *)&(((element_type *)
                         local_7a8.
                         super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                        _M_weak_this.
                        super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
          UNLOCK();
        }
        else {
          *(int *)&(((element_type *)
                    local_7a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                   _M_weak_this.super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr =
               *(int *)&(((element_type *)
                         local_7a8.
                         super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                        _M_weak_this.
                        super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
        }
      }
      local_428.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_428.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,mov_a_const,&local_7a8,&local_428);
      this_01._M_pi =
           local_7a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      if (local_428.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_428.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        this_01._M_pi =
             local_7a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
      }
    }
    else {
      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_8a0);
      iVar1 = *(int *)(local_8a0._0_8_ + 0x1c);
      if ((element_type *)local_8a0._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_);
      }
      if (iVar1 == 1) {
        local_7b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_7b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
        if (local_7b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_7b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_7b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_7b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_7b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_880._0_4_ = B;
        std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
                  ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_8a0,
                   (allocator<nigel::IM_SFR> *)(local_8a0 + 0x10),(SFR *)local_880);
        uVar2 = local_8a0._8_8_;
        local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_8a0._0_8_;
        local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_;
        local_8a0._0_8_ = (element_type *)0x0;
        local_8a0._8_8_ = (element_type *)0x0;
        addCmd(this,mov_adr_const,&local_7b8,&local_d8);
        if ((element_type *)uVar2 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
        }
        if ((element_type *)local_8a0._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_);
        }
        if (local_7b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_7b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_7c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_7c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
        if (local_7c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_7c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_7c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_7c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_7c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_438.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_438.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_dptr_const,&local_7c8,&local_438);
        if (local_438.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_438.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_7c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_7c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_448.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_448.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_458.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_458.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,movx_a_dptr,&local_448,&local_458);
        this_01._M_pi =
             local_448.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        if (local_458.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_458.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
          this_01._M_pi =
               local_448.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
        }
      }
      else {
        IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_8a0);
        iVar1 = *(int *)(local_8a0._0_8_ + 0x1c);
        if ((element_type *)local_8a0._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_);
        }
        if ((iVar1 != 4) && (iVar1 != 2)) {
          return;
        }
        local_7d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_7d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
        if (local_7d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_7d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_7d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_7d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_7d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        generateLoadStackR0(this,&local_7d8);
        if (local_7d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_7d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_880._0_4_ = B;
        std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
                  ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_8a0,
                   (allocator<nigel::IM_SFR> *)(local_8a0 + 0x10),(SFR *)local_880);
        uVar2 = local_8a0._8_8_;
        local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_8a0._0_8_;
        local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_;
        local_8a0._0_8_ = (element_type *)0x0;
        local_8a0._8_8_ = (element_type *)0x0;
        local_468.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_468.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_adr_atr0,&local_e8,&local_468);
        if (local_468.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_468.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((element_type *)uVar2 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
        }
        if ((element_type *)local_8a0._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_);
        }
        local_7e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_7e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
        if ((element_type *)
            local_7e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&(((element_type *)
                      local_7e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                     _M_weak_this.super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr =
                 *(int *)&(((element_type *)
                           local_7e8.
                           super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                          _M_weak_this.
                          super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                 1;
            UNLOCK();
          }
          else {
            *(int *)&(((element_type *)
                      local_7e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                     _M_weak_this.super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr =
                 *(int *)&(((element_type *)
                           local_7e8.
                           super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                          _M_weak_this.
                          super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                 1;
          }
        }
        local_478.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_478.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_a_const,&local_7e8,&local_478);
        this_01._M_pi =
             local_7e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        if (local_478.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_478.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
          this_01._M_pi =
               local_7e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
        }
      }
    }
    break;
  case cc:
    local_7f8.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (token->super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_7f8.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (token->super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_7f8.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_7f8.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_7f8.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_7f8.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_7f8.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    BuilderExecutable::generateNotification
              (&this->super_BuilderExecutable,imp_operationOnTwoConstantsCanBePrevented,&local_7f8);
    if (local_7f8.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_7f8.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    local_880._0_4_ = B;
    std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
              ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_8a0,
               (allocator<nigel::IM_SFR> *)(local_8a0 + 0x10),(SFR *)local_880);
    local_558.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_8a0._0_8_;
    local_558.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_;
    local_8a0._0_8_ = (element_type *)0x0;
    local_8a0._8_8_ = (element_type *)0x0;
    local_808.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_808.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
    ;
    if (local_808.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_808.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_808.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_808.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_808.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    addCmd(this,mov_adr_const,&local_558,&local_808);
    if (local_808.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_808.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((element_type *)
        local_558.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_558.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((element_type *)local_8a0._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_);
    }
    local_818.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_818.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
    ;
    if ((element_type *)
        local_818.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(((element_type *)
                  local_818.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                 _M_weak_this.super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr =
             *(int *)&(((element_type *)
                       local_818.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                      _M_weak_this.super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr + 1;
        UNLOCK();
      }
      else {
        *(int *)&(((element_type *)
                  local_818.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                 _M_weak_this.super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr =
             *(int *)&(((element_type *)
                       local_818.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                      _M_weak_this.super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr + 1;
      }
    }
    local_488.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_488.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    addCmd(this,mov_a_const,&local_818,&local_488);
    this_01._M_pi =
         local_818.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if (local_488.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_488.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      this_01._M_pi =
           local_818.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
    }
    break;
  case ct:
    local_828.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_828.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
    ;
    if (local_828.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_828.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_828.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_828.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_828.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_498.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_498.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    addCmd(this,mov_a_const,&local_828,&local_498);
    if (local_498.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_498.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_828.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      return;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_828.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    return;
  case tv:
    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_8a0);
    iVar1 = *(int *)(local_8a0._0_8_ + 0x1c);
    if ((element_type *)local_8a0._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_);
    }
    if (iVar1 != 0) {
      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_8a0);
      iVar1 = *(int *)(local_8a0._0_8_ + 0x1c);
      if ((element_type *)local_8a0._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_);
      }
      if (iVar1 == 1) {
        local_880._0_4_ = B;
        std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
                  ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_8a0,
                   (allocator<nigel::IM_SFR> *)(local_8a0 + 0x10),(SFR *)local_880);
        uVar2 = local_8a0._8_8_;
        local_108.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_8a0._0_8_;
        local_108.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_;
        local_8a0._0_8_ = (element_type *)0x0;
        local_8a0._8_8_ = (element_type *)0x0;
        local_4a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_4a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,xch_a_adr,&local_108,&local_4a8);
        if (local_4a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_4a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((element_type *)uVar2 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
        }
        if ((element_type *)local_8a0._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_);
        }
        local_848.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_848.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
        if (local_848.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_848.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_848.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_848.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_848.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_4b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_4b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_dptr_const,&local_848,&local_4b8);
        if (local_4b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_4b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_848.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_848.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_4c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_4c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_4d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_4d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,movx_a_dptr,&local_4c8,&local_4d8);
        if (local_4d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_4d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_4c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_4c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_880._0_4_ = B;
        std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
                  ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_8a0,
                   (allocator<nigel::IM_SFR> *)(local_8a0 + 0x10),(SFR *)local_880);
        this_02._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_;
        local_118.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_8a0._0_8_;
        local_118.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_;
        local_8a0._0_8_ = (element_type *)0x0;
        local_8a0._8_8_ = (element_type *)0x0;
        local_4e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_4e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,xch_a_adr,&local_118,&local_4e8);
        this_00._M_pi =
             local_4e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
      }
      else {
        IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_8a0);
        iVar1 = *(int *)(local_8a0._0_8_ + 0x1c);
        if ((element_type *)local_8a0._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_);
        }
        if ((iVar1 != 4) && (iVar1 != 2)) {
          return;
        }
        local_880._0_4_ = A;
        std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
                  ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_8a0,
                   (allocator<nigel::IM_SFR> *)(local_8a0 + 0x10),(SFR *)local_880);
        uVar2 = local_8a0._8_8_;
        local_128.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_8a0._0_8_;
        local_128.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_;
        local_8a0._0_8_ = (element_type *)0x0;
        local_8a0._8_8_ = (element_type *)0x0;
        local_4f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_4f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,push_adr,&local_128,&local_4f8);
        if (local_4f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_4f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((element_type *)uVar2 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
        }
        if ((element_type *)local_8a0._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_);
        }
        local_858.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_858.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
        if (local_858.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_858.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_858.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_858.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_858.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        generateLoadStackR0(this,&local_858);
        if (local_858.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_858.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_880._0_4_ = B;
        std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
                  ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_8a0,
                   (allocator<nigel::IM_SFR> *)(local_8a0 + 0x10),(SFR *)local_880);
        uVar2 = local_8a0._8_8_;
        local_138.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_8a0._0_8_;
        local_138.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_;
        local_8a0._0_8_ = (element_type *)0x0;
        local_8a0._8_8_ = (element_type *)0x0;
        local_508.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_508.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_adr_atr0,&local_138,&local_508);
        if (local_508.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_508.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((element_type *)uVar2 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
        }
        if ((element_type *)local_8a0._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_);
        }
        local_880._0_4_ = A;
        std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
                  ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_8a0,
                   (allocator<nigel::IM_SFR> *)(local_8a0 + 0x10),(SFR *)local_880);
        this_02._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_;
        local_148.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_8a0._0_8_;
        local_148.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_;
        local_8a0._0_8_ = (element_type *)0x0;
        local_8a0._8_8_ = (element_type *)0x0;
        local_518.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_518.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,pop_adr,&local_148,&local_518);
        this_00._M_pi =
             local_518.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
      }
      this_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_;
      if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
        this_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_;
      }
      goto joined_r0x0015a85d;
    }
    local_838.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_838.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
    ;
    if ((element_type *)
        local_838.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(((element_type *)
                  local_838.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                 _M_weak_this.super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr =
             *(int *)&(((element_type *)
                       local_838.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                      _M_weak_this.super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr + 1;
        UNLOCK();
      }
      else {
        *(int *)&(((element_type *)
                  local_838.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                 _M_weak_this.super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr =
             *(int *)&(((element_type *)
                       local_838.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                      _M_weak_this.super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr + 1;
      }
    }
    local_880._0_4_ = B;
    std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
              ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_8a0,
               (allocator<nigel::IM_SFR> *)(local_8a0 + 0x10),(SFR *)local_880);
    uVar2 = local_8a0._8_8_;
    local_f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_8a0._0_8_;
    local_f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_;
    local_8a0._0_8_ = (element_type *)0x0;
    local_8a0._8_8_ = (element_type *)0x0;
    addCmd(this,mov_adr_adr,&local_838,&local_f8);
    if ((element_type *)uVar2 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
    }
    this_01._M_pi =
         local_838.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if ((element_type *)local_8a0._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_);
      this_01._M_pi =
           local_838.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
    }
    break;
  case tc:
    local_880._0_4_ = B;
    std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
              ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_8a0,
               (allocator<nigel::IM_SFR> *)(local_8a0 + 0x10),(SFR *)local_880);
    local_568.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_8a0._0_8_;
    local_568.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_;
    local_8a0._0_8_ = (element_type *)0x0;
    local_8a0._8_8_ = (element_type *)0x0;
    local_868.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_868.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
    ;
    if (local_868.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_868.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_868.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_868.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_868.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    addCmd(this,mov_adr_const,&local_568,&local_868);
    this_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_;
    this_02._M_pi =
         local_568.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if (local_868.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_868.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      this_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_;
      this_02._M_pi =
           local_568.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
    }
joined_r0x0015a85d:
    local_8a0._8_8_ = this_01._M_pi;
    if ((element_type *)this_02._M_pi != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02._M_pi);
      this_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8a0._8_8_;
    }
    break;
  default:
    goto switchD_00159ef9_default;
  }
  if ((element_type *)this_01._M_pi != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
  }
switchD_00159ef9_default:
  return;
}

Assistant:

void IMC_Generator::generateMoveAB( OperationCombination comb, std::shared_ptr<IM_Operator> lOp, std::shared_ptr<IM_Operator> rOp, std::shared_ptr<Token> token )
	{
		if( comb == OC::vv )
		{
			if( lOp->as<IM_Variable>()->model == MemModel::fast &&
				rOp->as<IM_Variable>()->model == MemModel::fast )
			{
				addCmd( HexOp::mov_adr_adr, rOp, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				addCmd( HexOp::mov_a_adr, lOp );
			}
			else if( lOp->as<IM_Variable>()->model == MemModel::large &&
					 rOp->as<IM_Variable>()->model == MemModel::fast )
			{
				addCmd( HexOp::mov_dptr_const, lOp );
				addCmd( HexOp::movx_a_dptr );
				addCmd( HexOp::mov_adr_adr, rOp, IM_SFR::getSFR( IM_SFR::SFR::B ) );
			}
			else if( lOp->as<IM_Variable>()->isOnStack() &&
				rOp->as<IM_Variable>()->model == MemModel::fast )
			{
				generateLoadStackR0( lOp );
				addCmd( HexOp::mov_adr_adr, rOp, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				addCmd( HexOp::mov_a_atr0 );
			}
			else if( lOp->as<IM_Variable>()->model == MemModel::fast &&
					 rOp->as<IM_Variable>()->model == MemModel::large )
			{
				addCmd( HexOp::mov_dptr_const, rOp );
				addCmd( HexOp::movx_a_dptr );
				addCmd( HexOp::mov_adr_a, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				addCmd( HexOp::mov_a_adr, lOp );
			}
			else if( lOp->as<IM_Variable>()->model == MemModel::large &&
					 rOp->as<IM_Variable>()->model == MemModel::large )
			{
				addCmd( HexOp::mov_dptr_const, rOp );
				addCmd( HexOp::movx_a_dptr );
				addCmd( HexOp::mov_adr_a, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				addCmd( HexOp::mov_dptr_const, lOp );
				addCmd( HexOp::movx_a_dptr );
			}
			else if( lOp->as<IM_Variable>()->isOnStack() &&
					 rOp->as<IM_Variable>()->model == MemModel::large )
			{
				generateLoadStackR0( lOp );
				addCmd( HexOp::mov_dptr_const, rOp );
				addCmd( HexOp::movx_a_dptr );
				addCmd( HexOp::mov_adr_a, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				addCmd( HexOp::mov_a_atr0 );
			}
			else if( lOp->as<IM_Variable>()->model == MemModel::fast &&
					 rOp->as<IM_Variable>()->isOnStack() )
			{
				generateLoadStackR0( rOp );
				addCmd( HexOp::mov_adr_atr0, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				addCmd( HexOp::mov_a_adr, lOp );
			}
			else if( lOp->as<IM_Variable>()->model == MemModel::large &&
					 rOp->as<IM_Variable>()->isOnStack() )
			{
				generateLoadStackR0( rOp );
				addCmd( HexOp::mov_adr_atr0, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				addCmd( HexOp::mov_dptr_const, lOp );
				addCmd( HexOp::movx_a_dptr );
			}
			else if( lOp->as<IM_Variable>()->isOnStack() &&
					 rOp->as<IM_Variable>()->isOnStack() )
			{
				generateLoadStackR0( rOp );
				addCmd( HexOp::mov_adr_atr0, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				generateLoadStackR0( lOp );
				addCmd( HexOp::mov_a_atr0 );
			}
		}
		else if( comb == OC::vc )
		{
			if( lOp->as<IM_Variable>()->model == MemModel::fast )
			{
				addCmd( HexOp::mov_adr_const, IM_SFR::getSFR( IM_SFR::SFR::B ), rOp );
				addCmd( HexOp::mov_a_adr, lOp );
			}
			else if( lOp->as<IM_Variable>()->model == MemModel::large )
			{
				addCmd( HexOp::mov_adr_const, IM_SFR::getSFR( IM_SFR::SFR::B ), rOp );
				addCmd( HexOp::mov_dptr_const, lOp );
				addCmd( HexOp::movx_a_dptr );
			}
			else if( lOp->as<IM_Variable>()->isOnStack() )
			{
				generateLoadStackR0( lOp );
				addCmd( HexOp::mov_adr_const, IM_SFR::getSFR( IM_SFR::SFR::B ), rOp );
				addCmd( HexOp::mov_a_atr0 );
			}
		}
		else if( comb == OC::vt )
		{
			if( lOp->as<IM_Variable>()->model == MemModel::fast )
			{
				addCmd( HexOp::mov_a_adr, lOp );
			}
			else if( lOp->as<IM_Variable>()->model == MemModel::large )
			{
				addCmd( HexOp::mov_dptr_const, lOp );
				addCmd( HexOp::movx_a_dptr );
			}
			else if( lOp->as<IM_Variable>()->isOnStack() )
			{
				generateLoadStackR0( lOp );
				addCmd( HexOp::mov_a_atr0 );
			}
		}
		else if( comb == OC::cv )
		{
			if( rOp->as<IM_Variable>()->model == MemModel::fast )
			{
				addCmd( HexOp::mov_adr_adr, rOp, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				addCmd( HexOp::mov_a_const, lOp );
			}
			else if( rOp->as<IM_Variable>()->model == MemModel::large )
			{
				addCmd( HexOp::mov_adr_const, rOp, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				addCmd( HexOp::mov_dptr_const, lOp );
				addCmd( HexOp::movx_a_dptr );
			}
			else if( rOp->as<IM_Variable>()->isOnStack() )
			{
				generateLoadStackR0( rOp );
				addCmd( HexOp::mov_adr_atr0, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				addCmd( HexOp::mov_a_const, lOp );
			}
		}
		else if( comb == OC::cc )
		{
			generateNotification( NT::imp_operationOnTwoConstantsCanBePrevented, token );
			addCmd( HexOp::mov_adr_const, IM_SFR::getSFR( IM_SFR::SFR::B ), rOp );
			addCmd( HexOp::mov_a_const, lOp );
		}
		else if( comb == OC::ct )
		{
			addCmd( HexOp::mov_a_const, lOp );
		}
		else if( comb == OC::tv )
		{
			if( rOp->as<IM_Variable>()->model == MemModel::fast )
			{
				addCmd( HexOp::mov_adr_adr, rOp, IM_SFR::getSFR( IM_SFR::SFR::B ) );
			}
			else if( rOp->as<IM_Variable>()->model == MemModel::large )
			{
				addCmd( HexOp::xch_adr_a, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				addCmd( HexOp::mov_dptr_const, rOp );
				addCmd( HexOp::movx_a_dptr );
				addCmd( HexOp::xch_a_adr, IM_SFR::getSFR( IM_SFR::SFR::B ) );
			}
			else if( rOp->as<IM_Variable>()->isOnStack() )
			{
				addCmd( HexOp::push_adr, IM_SFR::getSFR( IM_SFR::SFR::A ) );
				generateLoadStackR0( rOp );
				addCmd( HexOp::mov_adr_atr0, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				addCmd( HexOp::pop_adr, IM_SFR::getSFR( IM_SFR::SFR::A ) );
			}
		}
		else if( comb == OC::tc )
		{
			addCmd( HexOp::mov_adr_const, IM_SFR::getSFR( IM_SFR::SFR::B ), rOp );
		}
		//Ignore OC::tt because it is already correct.
	}